

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
ranges::detail::to_container::fn<ranges::detail::from_range<std::vector>>::
impl<std::vector<int,std::allocator<int>>,ranges::basic_iterator<ranges::adaptor_cursor<std::_Rb_tree_const_iterator<std::pair<int_const,njoy::ENDFtk::tree::Material>>,ranges::iter_transform_view<ranges::ref_view<std::multimap<int,njoy::ENDFtk::tree::Material,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Material>>>const>,ranges::indirected<ranges::detail::get_first>>::adaptor<false>>>,ranges::transform_view<ranges::ref_view<std::multimap<int,njoy::ENDFtk::tree::Material,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Material>>>const>,ranges::detail::get_first>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          fn<ranges::detail::from_range<std::vector>> *this)

{
  vector<int,_std::allocator<int>_> c;
  vector<int,_std::allocator<int>_> local_28;
  
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_28,*(size_type *)(*(long *)(this + 8) + 0x28));
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<ranges::basic_iterator<ranges::adaptor_cursor<std::_Rb_tree_const_iterator<std::pair<int_const,njoy::ENDFtk::tree::Material>>,ranges::iter_transform_view<ranges::ref_view<std::multimap<int,njoy::ENDFtk::tree::Material,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Material>>>const>,ranges::indirected<ranges::detail::get_first>>::adaptor<false>>>>
            ((vector<int,std::allocator<int>> *)&local_28,
             *(undefined8 *)(*(long *)(this + 8) + 0x18),*(long *)(this + 8) + 8);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

static auto impl(Rng && rng, std::true_type)
            {
                Cont c;
                auto const rng_size = ranges::size(rng);
                using size_type = decltype(c.max_size());
                using C = common_type_t<range_size_t<Rng>, size_type>;
                RANGES_EXPECT(static_cast<C>(rng_size) <= static_cast<C>(c.max_size()));
                c.reserve(static_cast<size_type>(rng_size));
                c.assign(I{ranges::begin(rng)}, I{ranges::end(rng)});
                return c;
            }